

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O2

void crnlib::
     hash_map<crn::block,_crnlib::empty_type,_crnlib::hasher<crn::block>,_crnlib::equal_to<crn::block>_>
     ::construct_value_type(value_type *pDst,block *k,empty_type *v)

{
  crn::block::block(&pDst->first,k);
  pDst->field_0x40 = *v;
  return;
}

Assistant:

static inline void construct_value_type(value_type* pDst, const Key& k, const Value& v)
        {
            if (CRNLIB_IS_BITWISE_COPYABLE(Key))
            {
                memcpy(&pDst->first, &k, sizeof(Key));
            }
            else
            {
                scalar_type<Key>::construct(&pDst->first, k);
            }

            if (CRNLIB_IS_BITWISE_COPYABLE(Value))
            {
                memcpy(&pDst->second, &v, sizeof(Value));
            }
            else
            {
                scalar_type<Value>::construct(&pDst->second, v);
            }
        }